

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fStencilTexturingTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_1::checkDepthStencilFormatSupport
               (Context *context,deUint32 format)

{
  bool bVar1;
  uint uVar2;
  NotSupportedError *this;
  string sStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  code *local_28;
  undefined4 local_20;
  
  if (format == 0x8d48) {
    uVar2 = (*context->m_renderCtx->_vptr_RenderContext[2])();
    if ((uVar2 & 0x3ff) != 0x123) {
      bVar1 = glu::ContextInfo::isExtensionSupported
                        (context->m_contextInfo,"GL_OES_texture_stencil8");
      if (!bVar1) {
        this = (NotSupportedError *)__cxa_allocate_exception(0x38);
        local_28 = glu::getTextureFormatName;
        local_20 = 0x8d48;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&sStack_88,&local_28);
        std::operator+(&local_68,&sStack_88," requires ");
        std::operator+(&local_48,&local_68,"GL_OES_texture_stencil8");
        tcu::NotSupportedError::NotSupportedError(this,&local_48);
        __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
    }
  }
  return;
}

Assistant:

static void checkDepthStencilFormatSupport (Context& context, deUint32 format)
{
	if (format == GL_STENCIL_INDEX8)
	{
		const char* reqExt = "GL_OES_texture_stencil8";
		if ((context.getRenderContext().getType().getAPI() != glu::ApiType::core(3,2)) && !context.getContextInfo().isExtensionSupported(reqExt))
			throw tcu::NotSupportedError(glu::getTextureFormatStr(format).toString() + " requires " + reqExt);
	}
	else
	{
		DE_ASSERT(format == GL_DEPTH32F_STENCIL8 || format == GL_DEPTH24_STENCIL8);
	}
}